

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void icu_63::getDefaultTZName(UnicodeString *tzid,UBool isDST,UnicodeString *zonename)

{
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [5];
  UnicodeString local_50;
  
  UnicodeString::operator=(zonename,tzid);
  if (isDST == '\0') {
    local_80.p_ = L"(STD)";
    UnicodeString::UnicodeString(&local_50,'\x01',&local_80,-1);
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(zonename,&local_50,0,local_50.fUnion.fFields.fLength);
    UnicodeString::~UnicodeString(&local_50);
  }
  else {
    local_78[0].p_ = L"(DST)";
    UnicodeString::UnicodeString(&local_50,'\x01',local_78,-1);
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(zonename,&local_50,0,local_50.fUnion.fFields.fLength);
    UnicodeString::~UnicodeString(&local_50);
  }
  return;
}

Assistant:

static void getDefaultTZName(const UnicodeString &tzid, UBool isDST, UnicodeString& zonename) {
    zonename = tzid;
    if (isDST) {
        zonename += UNICODE_STRING_SIMPLE("(DST)");
    } else {
        zonename += UNICODE_STRING_SIMPLE("(STD)");
    }
}